

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void xmlFormatError(xmlError *err,xmlGenericErrorFunc channel,void *data)

{
  int iVar1;
  uint uVar2;
  xmlErrorLevel xVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  char *str;
  uint uVar7;
  xmlParserInputPtr pxVar8;
  long lVar9;
  char *pcVar10;
  void *pvVar11;
  xmlChar buf [150];
  xmlParserInputPtr local_100;
  undefined2 local_c8 [76];
  
  if (channel == (xmlGenericErrorFunc)0x0 || err == (xmlError *)0x0) {
    return;
  }
  iVar1 = err->code;
  if (iVar1 == 0) {
    return;
  }
  uVar2 = err->domain;
  pvVar4 = err->node;
  pvVar11 = (void *)0x0;
  if ((uVar2 < 0x18) && ((0x80013aU >> (uVar2 & 0x1f) & 1) != 0)) {
    pvVar11 = err->ctxt;
  }
  if ((pvVar4 == (void *)0x0) || (uVar2 == 0x11 || *(int *)((long)pvVar4 + 8) != 1)) {
    lVar9 = 0;
  }
  else {
    lVar9 = *(long *)((long)pvVar4 + 0x10);
  }
  xVar3 = err->level;
  str = err->message;
  uVar7 = err->line;
  if ((pvVar11 == (void *)0x0) ||
     (local_100 = *(xmlParserInputPtr *)((long)pvVar11 + 0x38), local_100 == (xmlParserInputPtr)0x0)
     ) {
    if (err->file == (char *)0x0) {
      pxVar8 = (xmlParserInputPtr)0x0;
      if (uVar7 == 0) {
        local_100 = (xmlParserInputPtr)0x0;
        goto LAB_0012f51a;
      }
      if (uVar2 < 0x14) {
        local_100 = (xmlParserInputPtr)0x0;
        if ((0xf0012U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_0012f51a;
        (*channel)(data,"Entity: line %d: ",(ulong)uVar7);
      }
    }
    else {
      (*channel)(data,"%s:%d: ");
    }
    pxVar8 = (xmlParserInputPtr)0x0;
    local_100 = (xmlParserInputPtr)0x0;
  }
  else {
    pcVar10 = local_100->filename;
    pxVar8 = local_100;
    if (pcVar10 == (char *)0x0) {
      if ((long)*(int *)((long)pvVar11 + 0x40) < 2) {
        local_100 = (xmlParserInputPtr)0x0;
      }
      else {
        pxVar8 = *(xmlParserInputPtr *)
                  (*(long *)((long)pvVar11 + 0x48) + -0x10 +
                  (long)*(int *)((long)pvVar11 + 0x40) * 8);
        pcVar10 = pxVar8->filename;
        if (pcVar10 != (char *)0x0) goto LAB_0012f45b;
      }
      if (uVar7 != 0 && uVar2 == 1) {
        (*channel)(data,"Entity: line %d: ",(ulong)(uint)pxVar8->line);
      }
    }
    else {
      local_100 = (xmlParserInputPtr)0x0;
LAB_0012f45b:
      (*channel)(data,"%s:%d: ",pcVar10,(ulong)(uint)pxVar8->line);
    }
  }
LAB_0012f51a:
  if (lVar9 != 0) {
    (*channel)(data,"element %s: ",lVar9);
  }
  uVar5 = uVar2 - 1;
  if ((uVar5 < 0x1e) && ((0x3e7fbcfdU >> (uVar5 & 0x1f) & 1) != 0)) {
    (*channel)(data,&DAT_001cbb54 + *(int *)(&DAT_001cbb54 + (ulong)uVar5 * 4));
  }
  if (xVar3 < 4) {
    (*channel)(data,&DAT_001cbbcc + *(int *)(&DAT_001cbbcc + (ulong)xVar3 * 4));
  }
  if ((xmlChar *)str == (xmlChar *)0x0) {
    pcVar10 = "%s\n";
    str = "No error message provided";
  }
  else {
    uVar5 = xmlStrlen((xmlChar *)str);
    if (((int)uVar5 < 1) || (((xmlChar *)str)[(ulong)uVar5 - 1] == '\n')) {
      pcVar10 = "%s";
    }
    else {
      pcVar10 = "%s\n";
    }
  }
  (*channel)(data,pcVar10,str);
  if (pvVar11 == (void *)0x0) goto LAB_0012f6fc;
  if (pxVar8 != (xmlParserInputPtr)0x0) {
    if (pxVar8->buf == (xmlParserInputBufferPtr)0x0) {
      if (iVar1 == 0x51) goto LAB_0012f636;
    }
    else if ((iVar1 == 0x51) && (pxVar8->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
LAB_0012f636:
      if (pxVar8->cur < pxVar8->end) {
        (*channel)(data,"Bytes:");
        lVar9 = 0;
        do {
          if (pxVar8->end <= pxVar8->cur + lVar9) break;
          (*channel)(data," 0x%02X",(ulong)pxVar8->cur[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        (*channel)(data,"\n");
      }
    }
  }
  xmlParserPrintFileContextInternal(pxVar8,channel,data);
  if (local_100 != (xmlParserInputPtr)0x0) {
    if (local_100->filename == (char *)0x0) {
      if (uVar7 != 0 && uVar2 == 1) {
        (*channel)(data,"Entity: line %d: \n",(ulong)(uint)local_100->line);
      }
    }
    else {
      (*channel)(data,"%s:%d: \n",local_100->filename,(ulong)(uint)local_100->line);
    }
    xmlParserPrintFileContextInternal(local_100,channel,data);
  }
LAB_0012f6fc:
  if ((((uVar2 == 0xc) && ((xmlChar *)err->str1 != (xmlChar *)0x0)) &&
      (iVar1 = err->int1, iVar1 < 100)) && (iVar6 = xmlStrlen((xmlChar *)err->str1), iVar1 < iVar6))
  {
    (*channel)(data,"%s\n",err->str1);
    uVar2 = err->int1;
    uVar7 = 0;
    if (0 < (long)(int)uVar2) {
      memset(local_c8,0x20,(long)(int)uVar2);
      uVar7 = uVar2;
    }
    *(undefined2 *)((long)local_c8 + (ulong)uVar7) = 0x5e;
    (*channel)(data,"%s\n",local_c8);
  }
  return;
}

Assistant:

void
xmlFormatError(const xmlError *err, xmlGenericErrorFunc channel, void *data)
{
    const char *message;
    const char *file;
    int line;
    int code;
    int domain;
    const xmlChar *name = NULL;
    xmlNodePtr node;
    xmlErrorLevel level;
    xmlParserCtxtPtr ctxt = NULL;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;

    if ((err == NULL) || (channel == NULL))
        return;

    message = err->message;
    file = err->file;
    line = err->line;
    code = err->code;
    domain = err->domain;
    level = err->level;
    node = err->node;

    if (code == XML_ERR_OK)
        return;

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = err->ctxt;
    }

    if ((node != NULL) && (node->type == XML_ELEMENT_NODE) &&
        (domain != XML_FROM_SCHEMASV))
        name = node->name;

    /*
     * Maintain the compatibility with the legacy error handling
     */
    if ((ctxt != NULL) && (ctxt->input != NULL)) {
        input = ctxt->input;
        if ((input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            cur = input;
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        if (input->filename)
            channel(data, "%s:%d: ", input->filename, input->line);
        else if ((line != 0) && (domain == XML_FROM_PARSER))
            channel(data, "Entity: line %d: ", input->line);
    } else {
        if (file != NULL)
            channel(data, "%s:%d: ", file, line);
        else if ((line != 0) &&
	         ((domain == XML_FROM_PARSER) || (domain == XML_FROM_SCHEMASV)||
		  (domain == XML_FROM_SCHEMASP)||(domain == XML_FROM_DTD) ||
		  (domain == XML_FROM_RELAXNGP)||(domain == XML_FROM_RELAXNGV)))
            channel(data, "Entity: line %d: ", line);
    }
    if (name != NULL) {
        channel(data, "element %s: ", name);
    }
    switch (domain) {
        case XML_FROM_PARSER:
            channel(data, "parser ");
            break;
        case XML_FROM_NAMESPACE:
            channel(data, "namespace ");
            break;
        case XML_FROM_DTD:
        case XML_FROM_VALID:
            channel(data, "validity ");
            break;
        case XML_FROM_HTML:
            channel(data, "HTML parser ");
            break;
        case XML_FROM_MEMORY:
            channel(data, "memory ");
            break;
        case XML_FROM_OUTPUT:
            channel(data, "output ");
            break;
        case XML_FROM_IO:
            channel(data, "I/O ");
            break;
        case XML_FROM_XINCLUDE:
            channel(data, "XInclude ");
            break;
        case XML_FROM_XPATH:
            channel(data, "XPath ");
            break;
        case XML_FROM_XPOINTER:
            channel(data, "parser ");
            break;
        case XML_FROM_REGEXP:
            channel(data, "regexp ");
            break;
        case XML_FROM_MODULE:
            channel(data, "module ");
            break;
        case XML_FROM_SCHEMASV:
            channel(data, "Schemas validity ");
            break;
        case XML_FROM_SCHEMASP:
            channel(data, "Schemas parser ");
            break;
        case XML_FROM_RELAXNGP:
            channel(data, "Relax-NG parser ");
            break;
        case XML_FROM_RELAXNGV:
            channel(data, "Relax-NG validity ");
            break;
        case XML_FROM_CATALOG:
            channel(data, "Catalog ");
            break;
        case XML_FROM_C14N:
            channel(data, "C14N ");
            break;
        case XML_FROM_XSLT:
            channel(data, "XSLT ");
            break;
        case XML_FROM_I18N:
            channel(data, "encoding ");
            break;
        case XML_FROM_SCHEMATRONV:
            channel(data, "schematron ");
            break;
        case XML_FROM_BUFFER:
            channel(data, "internal buffer ");
            break;
        case XML_FROM_URI:
            channel(data, "URI ");
            break;
        default:
            break;
    }
    switch (level) {
        case XML_ERR_NONE:
            channel(data, ": ");
            break;
        case XML_ERR_WARNING:
            channel(data, "warning : ");
            break;
        case XML_ERR_ERROR:
            channel(data, "error : ");
            break;
        case XML_ERR_FATAL:
            channel(data, "error : ");
            break;
    }
    if (message != NULL) {
        int len;
	len = xmlStrlen((const xmlChar *) message);
	if ((len > 0) && (message[len - 1] != '\n'))
	    channel(data, "%s\n", message);
	else
	    channel(data, "%s", message);
    } else {
        channel(data, "%s\n", "No error message provided");
    }

    if (ctxt != NULL) {
        if ((input != NULL) &&
            ((input->buf == NULL) || (input->buf->encoder == NULL)) &&
            (code == XML_ERR_INVALID_ENCODING) &&
            (input->cur < input->end)) {
            int i;

            channel(data, "Bytes:");
            for (i = 0; i < 4; i++) {
                if (input->cur + i >= input->end)
                    break;
                channel(data, " 0x%02X", input->cur[i]);
            }
            channel(data, "\n");
        }

        xmlParserPrintFileContextInternal(input, channel, data);

        if (cur != NULL) {
            if (cur->filename)
                channel(data, "%s:%d: \n", cur->filename, cur->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: \n", cur->line);
            xmlParserPrintFileContextInternal(cur, channel, data);
        }
    }
    if ((domain == XML_FROM_XPATH) && (err->str1 != NULL) &&
        (err->int1 < 100) &&
	(err->int1 < xmlStrlen((const xmlChar *)err->str1))) {
	xmlChar buf[150];
	int i;

	channel(data, "%s\n", err->str1);
	for (i=0;i < err->int1;i++)
	     buf[i] = ' ';
	buf[i++] = '^';
	buf[i] = 0;
	channel(data, "%s\n", buf);
    }
}